

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O3

void __thiscall
OSTEI_VRR_Algorithm_Base::Create_WithOrder(OSTEI_VRR_Algorithm_Base *this,QAM *q,IdxOrder idx_order)

{
  pointer pcVar1;
  undefined1 local_88 [16];
  _Alloc_hider local_78;
  char local_68 [24];
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  local_50;
  
  local_88._0_4_ = (q->qam)._M_elems[0];
  local_88._4_4_ = (q->qam)._M_elems[1];
  local_88._8_4_ = (q->qam)._M_elems[2];
  local_88._12_4_ = (q->qam)._M_elems[3];
  pcVar1 = (q->tag)._M_dataplus._M_p;
  local_78._M_p = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (q->tag)._M_string_length);
  GenerateQuartetTargets((QuartetSet *)&local_50,(QAM *)local_88);
  Create_WithOrder(this,(QuartetSet *)&local_50,idx_order);
  std::
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  ::~_Rb_tree(&local_50);
  if (local_78._M_p != local_68) {
    operator_delete(local_78._M_p);
  }
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::Create_WithOrder(QAM q, IdxOrder idx_order)
{
    Create_WithOrder(GenerateQuartetTargets(q), idx_order);
}